

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

size_t google::protobuf::internal::WireFormat::FieldByteSize
                 (FieldDescriptor *field,Message *message)

{
  bool bVar1;
  CppType CVar2;
  int iVar3;
  Type type;
  Reflection *this;
  MapFieldBase *this_00;
  Descriptor *pDVar4;
  MessageOptions *pMVar5;
  size_t sVar6;
  size_t sVar7;
  size_t local_48;
  size_t our_size;
  size_t data_size;
  MapFieldBase *map_field;
  size_t count;
  Reflection *message_reflection;
  Message *message_local;
  FieldDescriptor *field_local;
  
  this = Message::GetReflection(message);
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    pDVar4 = FieldDescriptor::containing_type(field);
    pMVar5 = Descriptor::options(pDVar4);
    bVar1 = MessageOptions::message_set_wire_format(pMVar5);
    if (((bVar1) && (CVar2 = FieldDescriptor::cpp_type(field), CVar2 == CPPTYPE_MESSAGE)) &&
       (bVar1 = FieldDescriptor::is_repeated(field), !bVar1)) {
      sVar7 = MessageSetItemByteSize(field,message);
      return sVar7;
    }
  }
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    bVar1 = FieldDescriptor::is_map(field);
    if (bVar1) {
      this_00 = Reflection::GetMapData(this,message,field);
      bVar1 = MapFieldBase::IsMapValid(this_00);
      if (bVar1) {
        iVar3 = MapFieldBase::size(this_00);
        map_field = (MapFieldBase *)FromIntSize(iVar3);
      }
      else {
        iVar3 = Reflection::FieldSize(this,message,field);
        map_field = (MapFieldBase *)FromIntSize(iVar3);
      }
    }
    else {
      iVar3 = Reflection::FieldSize(this,message,field);
      map_field = (MapFieldBase *)FromIntSize(iVar3);
    }
  }
  else {
    pDVar4 = FieldDescriptor::containing_type(field);
    pMVar5 = Descriptor::options(pDVar4);
    bVar1 = MessageOptions::map_entry(pMVar5);
    if (bVar1) {
      map_field = (MapFieldBase *)0x1;
    }
    else {
      bVar1 = Reflection::HasField(this,message,field);
      map_field = (MapFieldBase *)(ulong)bVar1;
    }
  }
  local_48 = FieldDataOnlyByteSize(field,message);
  bVar1 = FieldDescriptor::is_packed(field);
  if (bVar1) {
    if (local_48 != 0) {
      iVar3 = FieldDescriptor::number(field);
      sVar7 = TagSize(iVar3,TYPE_STRING);
      sVar6 = io::CodedOutputStream::VarintSize32((uint32_t)local_48);
      local_48 = local_48 + sVar6 + sVar7;
    }
  }
  else {
    iVar3 = FieldDescriptor::number(field);
    type = FieldDescriptor::type(field);
    sVar7 = TagSize(iVar3,type);
    local_48 = local_48 + (long)map_field * sVar7;
  }
  return local_48;
}

Assistant:

size_t WireFormat::FieldByteSize(const FieldDescriptor* field,
                                 const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  if (field->is_extension() &&
      field->containing_type()->options().message_set_wire_format() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      !field->is_repeated()) {
    return MessageSetItemByteSize(field, message);
  }

  size_t count = 0;
  if (field->is_repeated()) {
    if (field->is_map()) {
      const MapFieldBase* map_field =
          message_reflection->GetMapData(message, field);
      if (map_field->IsMapValid()) {
        count = FromIntSize(map_field->size());
      } else {
        count = FromIntSize(message_reflection->FieldSize(message, field));
      }
    } else {
      count = FromIntSize(message_reflection->FieldSize(message, field));
    }
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  const size_t data_size = FieldDataOnlyByteSize(field, message);
  size_t our_size = data_size;
  if (field->is_packed()) {
    if (data_size > 0) {
      // Packed fields get serialized like a string, not their native type.
      // Technically this doesn't really matter; the size only changes if it's
      // a GROUP
      our_size += TagSize(field->number(), FieldDescriptor::TYPE_STRING);
      our_size += io::CodedOutputStream::VarintSize32(data_size);
    }
  } else {
    our_size += count * TagSize(field->number(), field->type());
  }
  return our_size;
}